

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVector<ImVec2> *this_00;
  ImVec2 IVar1;
  int a;
  value_type local_38;
  
  this_00 = &this->_Path;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    ImVector<ImVec2>::push_back(this_00,centre);
    return;
  }
  ImVector<ImVec2>::reserve(this_00,(a_max_of_12 - a_min_of_12) + (this->_Path).Size + 1);
  for (; a_min_of_12 <= a_max_of_12; a_min_of_12 = a_min_of_12 + 1) {
    IVar1 = this->_Data->CircleVtx12[a_min_of_12 % 0xc];
    local_38.x = IVar1.x * radius + (*centre).x;
    local_38.y = IVar1.y * radius + (*centre).y;
    ImVector<ImVec2>::push_back(this_00,&local_38);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->CircleVtx12[a % IM_ARRAYSIZE(_Data->CircleVtx12)];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}